

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O3

bool __thiscall CppUnit::Test::findTestPath(Test *this,Test *test,TestPath *testPath)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  uint uVar4;
  ulong uVar5;
  
  if (this == test) {
    (*testPath->_vptr_TestPath[3])(testPath,this);
LAB_00128845:
    uVar5 = 1;
  }
  else {
    uVar2 = (*this->_vptr_Test[4])(this);
    uVar5 = 0;
    if (0 < (int)uVar2) {
      do {
        iVar3 = (*this->_vptr_Test[5])(this,uVar5);
        cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x40))
                          ((long *)CONCAT44(extraout_var,iVar3),test,testPath);
        if (cVar1 != '\0') {
          (*testPath->_vptr_TestPath[5])(testPath,this,0);
          goto LAB_00128845;
        }
        uVar4 = (int)uVar5 + 1;
        uVar5 = (ulong)uVar4;
      } while (uVar2 != uVar4);
      uVar5 = 0;
    }
  }
  return SUB81(uVar5,0);
}

Assistant:

bool 
Test::findTestPath( const Test *test,
                    TestPath &testPath ) const
{
  Test *mutableThis = CPPUNIT_CONST_CAST( Test *, this );
  if ( this == test )
  {
    testPath.add( mutableThis );
    return true;
  }

  int childCount = getChildTestCount();
  for ( int childIndex =0; childIndex < childCount; ++childIndex )
  {
    if ( getChildTestAt( childIndex )->findTestPath( test, testPath ) )
    {
      testPath.insert( mutableThis, 0 );
      return true;
    }
  }

  return false;
}